

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O3

void Gia_CollectSuper(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  long lVar4;
  int Entry;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEnable.c"
                  ,0x48,"void Gia_CollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  vSuper->nSize = 0;
  uVar3 = *(ulong *)pObj & 0x1fffffff;
  if (uVar3 == 0x1fffffff || (int)*(ulong *)pObj < 0) {
    pGVar1 = p->pObjs;
    if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
      Entry = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
LAB_0068f857:
      Vec_IntPush(vSuper,Entry);
      return;
    }
  }
  else {
    pGVar1 = pObj + -uVar3;
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
      Vec_IntPush(vSuper,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar1 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar2 = p->pObjs;
      if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
        Entry = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555;
        if (0 < (long)vSuper->nSize) {
          lVar4 = 0;
          do {
            if (vSuper->pArray[lVar4] == Entry) {
              return;
            }
            lVar4 = lVar4 + 1;
          } while (vSuper->nSize != lVar4);
        }
        goto LAB_0068f857;
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_CollectSuper( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    assert( !Gia_IsComplement(pObj) );
    Vec_IntClear( vSuper );
//    Gia_CollectSuper_rec( p, pObj, vSuper );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_ObjFanin0(pObj)) );
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_ObjFanin1(pObj)) );
    }
    else
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_Regular(pObj)) );

}